

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int lj_record_objcmp(jit_State *J,TRef a,TRef b,cTValue *av,cTValue *bv)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  uint local_74;
  uint local_70;
  ushort local_68;
  IRType tb;
  IRType ta;
  int diff;
  cTValue *bv_local;
  cTValue *av_local;
  TRef b_local;
  TRef a_local;
  jit_State *J_local;
  
  iVar2 = lj_obj_equal(av,bv);
  uVar3 = (uint)((iVar2 != 0 ^ 0xffU) & 1);
  if (0x7fff < ((a | b) & 0xffff)) {
    if ((a >> 0x18 & 0x1f) - 0xf < 5) {
      local_70 = 0x13;
    }
    else {
      local_70 = a >> 0x18 & 0x1f;
    }
    local_68 = (ushort)local_70;
    if ((b >> 0x18 & 0x1f) - 0xf < 5) {
      local_74 = 0x13;
    }
    else {
      local_74 = b >> 0x18 & 0x1f;
    }
    av_local._0_4_ = b;
    av_local._4_4_ = a;
    if (local_70 != local_74) {
      if ((local_70 == 0x13) && (local_74 == 0xe)) {
        (J->fold).ins.field_0.ot = 0x5b0e;
        (J->fold).ins.field_0.op1 = (IRRef1)a;
        (J->fold).ins.field_0.op2 = 0x1d3;
        av_local._4_4_ = lj_opt_fold(J);
        local_68 = 0xe;
      }
      else {
        if ((local_70 != 0xe) || (local_74 != 0x13)) {
          return 2;
        }
        (J->fold).ins.field_0.ot = 0x5b0e;
        (J->fold).ins.field_0.op1 = (IRRef1)b;
        (J->fold).ins.field_0.op2 = 0x1d3;
        av_local._0_4_ = lj_opt_fold(J);
      }
    }
    sVar1 = 8;
    if (uVar3 != 0) {
      sVar1 = 9;
    }
    (J->fold).ins.field_0.ot = sVar1 << 8 | local_68 | 0x80;
    (J->fold).ins.field_0.op1 = (IRRef1)av_local._4_4_;
    (J->fold).ins.field_0.op2 = (IRRef1)(TRef)av_local;
    lj_opt_fold(J);
  }
  return uVar3;
}

Assistant:

int lj_record_objcmp(jit_State *J, TRef a, TRef b, cTValue *av, cTValue *bv)
{
  int diff = !lj_obj_equal(av, bv);
  if (!tref_isk2(a, b)) {  /* Shortcut, also handles primitives. */
    IRType ta = tref_isinteger(a) ? IRT_INT : tref_type(a);
    IRType tb = tref_isinteger(b) ? IRT_INT : tref_type(b);
    if (ta != tb) {
      /* Widen mixed number/int comparisons to number/number comparison. */
      if (ta == IRT_INT && tb == IRT_NUM) {
	a = emitir(IRTN(IR_CONV), a, IRCONV_NUM_INT);
	ta = IRT_NUM;
      } else if (ta == IRT_NUM && tb == IRT_INT) {
	b = emitir(IRTN(IR_CONV), b, IRCONV_NUM_INT);
      } else {
	return 2;  /* Two different types are never equal. */
      }
    }
    emitir(IRTG(diff ? IR_NE : IR_EQ, ta), a, b);
  }
  return diff;
}